

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

size_t testing::internal::GetThreadCount(void)

{
  ostream *this;
  __pid_t _Var1;
  size_t sVar2;
  int iVar3;
  int local_26c;
  string dummy;
  string filename;
  ifstream file;
  
  Message::Message((Message *)&file);
  this = (ostream *)(_file + 0x10);
  std::operator<<(this,"/proc/");
  _Var1 = getpid();
  std::ostream::operator<<(this,_Var1);
  std::operator<<(this,"/stat");
  StringStreamToString(&filename,_file);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&file);
  dummy._M_dataplus._M_p = (pointer)&dummy.field_2;
  dummy._M_string_length = 0;
  dummy.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&file,filename._M_dataplus._M_p,_S_in);
  for (iVar3 = -0x13; iVar3 != 0; iVar3 = iVar3 + 1) {
    std::operator>>((istream *)&file,(string *)&dummy);
  }
  local_26c = 0;
  std::istream::operator>>((istream *)&file,&local_26c);
  sVar2 = (size_t)local_26c;
  std::ifstream::~ifstream((istream *)&file);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return sVar2;
}

Assistant:

size_t GetThreadCount() {
  const std::string filename =
      (Message() << "/proc/" << getpid() << "/stat").GetString();
  return ReadProcFileField<int>(filename, 19);
}